

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O2

void __thiscall leveldb::_Test_GetOrderedByLevels::_Run(_Test_GetOrderedByLevels *this)

{
  Tester *this_00;
  string *v;
  string *k;
  DB *pDVar1;
  bool bVar2;
  allocator local_222;
  allocator local_221;
  undefined1 local_220 [72];
  undefined1 local_1d8 [16];
  Comparator local_1c8;
  
  this_00 = (Tester *)(local_1d8 + 8);
  v = (string *)(local_220 + 8);
  k = (string *)(local_220 + 0x28);
  do {
    test::Tester::Tester
              (this_00,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x2c6);
    std::__cxx11::string::string((string *)v,"foo",&local_221);
    std::__cxx11::string::string((string *)k,"v1",&local_222);
    DBTest::Put((DBTest *)local_220,(string *)this,v);
    test::Tester::IsOk(this_00,(Status *)local_220);
    Status::~Status((Status *)local_220);
    std::__cxx11::string::~string((string *)k);
    std::__cxx11::string::~string((string *)v);
    test::Tester::~Tester(this_00);
    local_1d8._8_8_ = "a";
    local_1c8._vptr_Comparator = (_func_int **)0x1;
    local_220._8_8_ = "z";
    local_220._16_8_ = 1;
    pDVar1 = (this->super_DBTest).db_;
    (*pDVar1->_vptr_DB[0xb])(pDVar1,this_00,v);
    test::Tester::Tester
              (this_00,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x2c8);
    std::__cxx11::string::string((string *)k,"foo",(allocator *)local_220);
    DBTest::Get(v,&this->super_DBTest,k,(Snapshot *)0x0);
    test::Tester::IsEq<char[3],std::__cxx11::string>(this_00,(char (*) [3])"v1",v);
    std::__cxx11::string::~string((string *)v);
    std::__cxx11::string::~string((string *)k);
    test::Tester::~Tester(this_00);
    test::Tester::Tester
              (this_00,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x2c9);
    std::__cxx11::string::string((string *)v,"foo",&local_221);
    std::__cxx11::string::string((string *)k,"v2",&local_222);
    DBTest::Put((DBTest *)local_220,(string *)this,v);
    test::Tester::IsOk(this_00,(Status *)local_220);
    Status::~Status((Status *)local_220);
    std::__cxx11::string::~string((string *)k);
    std::__cxx11::string::~string((string *)v);
    test::Tester::~Tester(this_00);
    test::Tester::Tester
              (this_00,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x2ca);
    std::__cxx11::string::string((string *)k,"foo",(allocator *)local_220);
    DBTest::Get(v,&this->super_DBTest,k,(Snapshot *)0x0);
    test::Tester::IsEq<char[3],std::__cxx11::string>(this_00,(char (*) [3])"v2",v);
    std::__cxx11::string::~string((string *)v);
    std::__cxx11::string::~string((string *)k);
    test::Tester::~Tester(this_00);
    DBImpl::TEST_CompactMemTable((DBImpl *)local_1d8);
    Status::~Status((Status *)local_1d8);
    test::Tester::Tester
              (this_00,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x2cc);
    std::__cxx11::string::string((string *)k,"foo",(allocator *)local_220);
    DBTest::Get(v,&this->super_DBTest,k,(Snapshot *)0x0);
    test::Tester::IsEq<char[3],std::__cxx11::string>(this_00,(char (*) [3])"v2",v);
    std::__cxx11::string::~string((string *)v);
    std::__cxx11::string::~string((string *)k);
    test::Tester::~Tester(this_00);
    bVar2 = DBTest::ChangeOptions(&this->super_DBTest);
  } while (bVar2);
  return;
}

Assistant:

TEST(DBTest, GetOrderedByLevels) {
  do {
    ASSERT_OK(Put("foo", "v1"));
    Compact("a", "z");
    ASSERT_EQ("v1", Get("foo"));
    ASSERT_OK(Put("foo", "v2"));
    ASSERT_EQ("v2", Get("foo"));
    dbfull()->TEST_CompactMemTable();
    ASSERT_EQ("v2", Get("foo"));
  } while (ChangeOptions());
}